

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O0

void __thiscall FTTYStartupScreen::NetInit(FTTYStartupScreen *this,char *message,int numplayers)

{
  undefined1 local_58 [8];
  termios rawtermios;
  int numplayers_local;
  char *message_local;
  FTTYStartupScreen *this_local;
  
  rawtermios.c_ispeed = numplayers;
  unique0x10000155 = message;
  if (((this->super_FStartupScreen).field_0x14 & 1) == 0) {
    fprintf(_stderr,"Press \'Q\' to abort network game synchronization.");
    tcgetattr(0,(termios *)&this->OldTermIOS);
    memcpy(local_58,&this->OldTermIOS,0x3c);
    rawtermios.c_oflag = rawtermios.c_oflag & 0xfffffff5;
    tcsetattr(0,0,(termios *)local_58);
    (this->super_FStartupScreen).field_0x14 = 1;
  }
  if (rawtermios.c_ispeed == 1) {
    fprintf(_stderr,"\n%s.",stack0xffffffffffffffe8);
  }
  else {
    fprintf(_stderr,"\n%s: ",stack0xffffffffffffffe8);
  }
  fflush(_stderr);
  this->TheNetMessage = stack0xffffffffffffffe8;
  this->NetMaxPos = rawtermios.c_ispeed;
  this->NetCurPos = 0;
  (*(this->super_FStartupScreen)._vptr_FStartupScreen[6])(this,1);
  return;
}

Assistant:

void FTTYStartupScreen::NetInit(const char *message, int numplayers)
{
	if (!DidNetInit)
	{
		termios rawtermios;

		fprintf (stderr, "Press 'Q' to abort network game synchronization.");
		// Set stdin to raw mode so we can get keypresses in ST_CheckNetAbort()
		// immediately without waiting for an EOL.
		tcgetattr (STDIN_FILENO, &OldTermIOS);
		rawtermios = OldTermIOS;
		rawtermios.c_lflag &= ~(ICANON | ECHO);
		tcsetattr (STDIN_FILENO, TCSANOW, &rawtermios);
		DidNetInit = true;
	}
	if (numplayers == 1)
	{
		// Status message without any real progress info.
		fprintf (stderr, "\n%s.", message);
	}
	else
	{
		fprintf (stderr, "\n%s: ", message);
	}
	fflush (stderr);
	TheNetMessage = message;
	NetMaxPos = numplayers;
	NetCurPos = 0;
	NetProgress(1);		// You always know about yourself
}